

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bool __thiscall
lzham::lzcompressor::extreme_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  state *this_00;
  uint *puVar1;
  node *pnVar2;
  search_accelerator *this_01;
  vector<lzham::lzcompressor::lzdecision> *this_02;
  uint new_capacity;
  uint uVar3;
  uint uVar4;
  bit_cost_t bVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  dict_match *pdVar12;
  uint8 *puVar13;
  bit_cost_t bVar14;
  ulong uVar15;
  ulong uVar16;
  lzdecision *plVar17;
  int iVar18;
  int iVar19;
  node *pnVar20;
  uint uVar21;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar22;
  ulong extraout_RDX_01;
  bit_cost_t *pbVar23;
  lzdecision *plVar24;
  uint uVar25;
  uint l;
  uint uVar26;
  uint min_len;
  uchar *puVar27;
  int iVar28;
  uint uVar29;
  uint is_match_model_index;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  node *this_03;
  ulong uStackY_d40;
  uint local_d24;
  lzdecision lzdec;
  uint local_d08;
  ulong local_cd0;
  node *local_ca0;
  uint match_distances [128];
  uint match_lens [128];
  bit_cost_t lzdec_bitcosts [258];
  
  (parse_state->super_raw_parse_thread_state).m_failed = false;
  (parse_state->super_raw_parse_thread_state).m_emit_decisions_backwards = true;
  pnVar2 = (parse_state->super_raw_parse_thread_state).m_nodes;
  for (lVar10 = 0x49a0; lVar10 != 0xb2a88; lVar10 = lVar10 + 0xe8) {
    *(undefined4 *)
     ((long)(parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_match_hist
     + lVar10 + -0x10) = 0;
  }
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_num_node_states = 1;
  uVar21 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_cur_state;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.m_cur_ofs =
       (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_cur_ofs;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.m_cur_state
       = uVar21;
  uVar6 = *(undefined8 *)
           ((parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_match_hist
           + 2);
  *(undefined8 *)
   (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.
   m_match_hist =
       *(undefined8 *)
        (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_match_hist;
  *(undefined8 *)
   ((parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.
    m_match_hist + 2) = uVar6;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_parent_index = -1;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_parent_state_index = -1;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost = 0;
  this_00 = &(parse_state->super_raw_parse_thread_state).m_approx_state;
  (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_complexity = 0;
  puVar1 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_match_hist;
  uVar31 = (parse_state->super_raw_parse_thread_state).m_start_ofs;
  new_capacity = (parse_state->super_raw_parse_thread_state).m_bytes_to_match;
  uVar11 = (ulong)new_capacity;
  this_01 = &this->m_accel;
  uVar21 = uVar31 - ((this->m_accel).m_max_dict_size_mask & (this->m_accel).m_lookahead_pos);
  local_ca0 = pnVar2;
  for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
    iVar18 = (int)uVar16;
    uVar8 = new_capacity - iVar18;
    uVar25 = 0x101;
    if (uVar8 < 0x101) {
      uVar25 = uVar8;
    }
    uVar9 = 0;
    puVar27 = (this->m_accel).m_dict.m_p;
    local_d08 = 0;
    if (0 < (int)(uVar31 - (parse_state->super_raw_parse_thread_state).m_approx_state.
                           m_block_start_dict_ofs)) {
      local_d08 = (uint)puVar27[uVar31 - 1];
    }
    uVar3 = (this->m_accel).m_cur_dict_size;
    if (uVar8 < 2) {
      local_cd0 = 0;
      local_d24 = 0;
    }
    else {
      pdVar12 = search_accelerator::find_matches(this_01,uVar21,true);
      if (pdVar12 == (dict_match *)0x0) {
        local_cd0 = 0;
        local_d24 = 0;
      }
      else {
        puVar13 = &pdVar12->m_len;
        uVar8 = 0;
        local_d24 = 0;
        do {
          uVar26 = *puVar13 + 2;
          if (uVar25 <= *puVar13 + 2) {
            uVar26 = uVar25;
          }
          uVar4 = ((dict_match *)(puVar13 + -4))->m_dist;
          if (local_d24 < uVar26) {
            match_lens[uVar8] = uVar26;
            match_distances[uVar8] = uVar4 & 0x7fffffff;
            uVar8 = uVar8 + 1;
            local_d24 = uVar26;
          }
          puVar13 = puVar13 + 5;
        } while (-1 < (int)uVar4);
        local_cd0 = (ulong)uVar8;
      }
      uVar9 = search_accelerator::get_len2_match(this_01,uVar21);
    }
    pnVar20 = pnVar2 + uVar16;
    puVar27 = puVar27 + uVar31;
    for (uVar33 = 0; uVar33 < pnVar20->m_num_node_states; uVar33 = uVar33 + 1) {
      if (uVar16 == 0) {
        uVar29 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
                 m_cur_state;
      }
      else {
        (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_cur_ofs =
             pnVar20->m_node_states[uVar33].m_saved_state.m_cur_ofs;
        uVar29 = pnVar20->m_node_states[uVar33].m_saved_state.m_cur_state;
        (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_cur_state =
             uVar29;
        uVar6 = *(undefined8 *)(pnVar20->m_node_states[uVar33].m_saved_state.m_match_hist + 2);
        *(undefined8 *)puVar1 =
             *(undefined8 *)pnVar20->m_node_states[uVar33].m_saved_state.m_match_hist;
        *(undefined8 *)
         ((parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_match_hist +
         2) = uVar6;
      }
      is_match_model_index = uVar29 * 0x40 + (local_d08 >> 2);
      bVar5 = pnVar20->m_node_states[uVar33].m_total_cost;
      uVar29 = pnVar20->m_node_states[uVar33].m_total_complexity;
      lVar10 = 0;
      uStackY_d40 = 1;
      uVar15 = 0;
      while( true ) {
        uVar22 = (ulong)uVar21;
        uVar8 = (uint)uVar15;
        iVar19 = (int)uVar33;
        if (lVar10 == 4) break;
        uVar26 = puVar1[lVar10];
        uVar22 = uVar15;
        if (uVar26 <= uVar3 + uVar21) {
          for (uVar32 = 0;
              (uVar32 < uVar25 &&
              ((this->m_accel).m_dict.m_p
               [uVar32 + ((uVar21 - uVar26) + (this->m_accel).m_lookahead_pos &
                         (this->m_accel).m_max_dict_size_mask)] == puVar27[uVar32]));
              uVar32 = uVar32 + 1) {
          }
          uVar26 = (uint)uVar32;
          if ((uint)uStackY_d40 <= uVar26) {
            uVar30 = (uint)lVar10;
            state::get_rep_match_costs
                      (this_00,(uint)puVar27,lzdec_bitcosts,uVar30,(uint)uStackY_d40,uVar26,
                       is_match_model_index);
            this_03 = local_ca0 + uStackY_d40;
            for (; uStackY_d40 <= uVar32; uStackY_d40 = uStackY_d40 + 1) {
              lzdec.m_dist = ~uVar30;
              lzdec.m_len = (int)uStackY_d40;
              lzdec.m_pos = uVar31;
              node::add_state(this_03,iVar18,iVar19,&lzdec,this_00,
                              lzdec_bitcosts[uStackY_d40] + bVar5,uVar30 + uVar29 + 2);
              this_03 = this_03 + 1;
            }
            uVar22 = uVar32 & 0xffffffff;
            if (uVar26 < uVar8) {
              uVar22 = uVar15;
            }
          }
        }
        lVar10 = lVar10 + 1;
        uStackY_d40 = 2;
        uVar15 = uVar22;
      }
      if (uVar9 != 0) {
        lzdec.m_dist = uVar9;
        lzdec.m_len = 2;
        lzdec.m_pos = uVar31;
        bVar14 = state::get_cost(this_00,&this->super_CLZBase,this_01,&lzdec);
        node::add_state(pnVar20 + 2,iVar18,iVar19,&lzdec,this_00,bVar14 + bVar5,uVar29 + 7);
        uVar22 = extraout_RDX;
        if (uVar8 < 3) {
          uVar8 = 2;
        }
      }
      if (uVar8 < local_d24) {
        uVar26 = uVar8 + (uVar8 == 0);
        for (uVar15 = 0; uVar15 != local_cd0; uVar15 = uVar15 + 1) {
          uVar4 = match_lens[uVar15];
          if (uVar8 < uVar4) {
            min_len = uVar26 + 1;
            uVar30 = match_distances[uVar15];
            state::get_full_match_costs
                      (this_00,&this->super_CLZBase,(uint)uVar22,lzdec_bitcosts,uVar30,min_len,uVar4
                       ,is_match_model_index);
            uVar22 = extraout_RDX_00;
            for (; uVar26 = uVar4, min_len <= uVar4; min_len = min_len + 1) {
              lzdec.m_dist = uVar30;
              lzdec.m_len = min_len;
              lzdec.m_pos = uVar31;
              node::add_state(pnVar20 + min_len,iVar18,iVar19,&lzdec,this_00,
                              lzdec_bitcosts[min_len] + bVar5,(min_len < 9) + 6 + uVar29);
              uVar22 = extraout_RDX_01;
            }
          }
        }
      }
      bVar14 = state::get_lit_cost(this_00,this_01,uVar31,local_d08,is_match_model_index);
      lzdec.m_len = 0;
      lzdec.m_dist = 0;
      lzdec.m_pos = uVar31;
      node::add_state(pnVar20 + 1,iVar18,iVar19,&lzdec,this_00,bVar5 + bVar14,uVar29 + 1);
    }
    uVar31 = uVar31 + 1;
    uVar21 = uVar21 + 1;
    local_ca0 = local_ca0 + 1;
  }
  this_02 = &(parse_state->super_raw_parse_thread_state).m_best_decisions;
  bVar7 = vector<lzham::lzcompressor::lzdecision>::try_reserve(this_02,new_capacity);
  if (bVar7) {
    pbVar23 = &(parse_state->super_raw_parse_thread_state).m_nodes[uVar11].m_node_states[0].
               m_total_cost;
    uVar16 = 0xffffffffffffffff;
    uVar33 = 0;
    for (uVar15 = 0; pnVar2[uVar11].m_num_node_states != uVar15; uVar15 = uVar15 + 1) {
      if (*pbVar23 < uVar16) {
        uVar33 = uVar15 & 0xffffffff;
        uVar16 = *pbVar23;
      }
      pbVar23 = pbVar23 + 7;
    }
    plVar17 = this_02->m_p;
    plVar24 = plVar17;
    do {
      iVar28 = (int)uVar11;
      iVar19 = (int)uVar33;
      plVar24->m_dist = pnVar2[iVar28].m_node_states[iVar19].m_lzdec.m_dist;
      iVar18 = pnVar2[iVar28].m_node_states[iVar19].m_lzdec.m_len;
      plVar24->m_pos = pnVar2[iVar28].m_node_states[iVar19].m_lzdec.m_pos;
      plVar24->m_len = iVar18;
      plVar24 = plVar24 + 1;
      uVar31 = (uint)pnVar2[iVar28].m_node_states[iVar19].m_parent_index;
      uVar11 = (ulong)uVar31;
      plVar17 = plVar17 + 1;
      uVar33 = (ulong)(uint)(int)pnVar2[iVar28].m_node_states[iVar19].m_parent_state_index;
    } while (0 < (int)uVar31);
    vector<lzham::lzcompressor::lzdecision>::try_resize
              (this_02,(uint)(((long)plVar17 - (long)this_02->m_p) / 0xc),false);
  }
  else {
    (parse_state->super_raw_parse_thread_state).m_failed = true;
  }
  return bVar7;
}

Assistant:

bool lzcompressor::extreme_parse(parse_thread_state &parse_state)
   {
      LZHAM_ASSERT(parse_state.m_bytes_to_match <= cMaxParseGraphNodes);

      parse_state.m_failed = false;
      parse_state.m_emit_decisions_backwards = true;

      node *pNodes = parse_state.m_nodes;
      for (uint i = 0; i <= cMaxParseGraphNodes; i++)
      {
         pNodes[i].clear();
      }

      state &approx_state = parse_state.m_approx_state;

      pNodes[0].m_num_node_states = 1;
      node_state &first_node_state = pNodes[0].m_node_states[0];
      approx_state.save_partial_state(first_node_state.m_saved_state);
      first_node_state.m_parent_index = -1;
      first_node_state.m_parent_state_index = -1;
      first_node_state.m_total_cost = 0;
      first_node_state.m_total_complexity = 0;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_node_index = 0;

      enum { cMaxFullMatches = cMatchAccelMaxSupportedProbes };
      uint match_lens[cMaxFullMatches];
      uint match_distances[cMaxFullMatches];

      bit_cost_t lzdec_bitcosts[cMaxMatchLen + 1];

      node prev_lit_node;
      prev_lit_node.clear();

      while (cur_node_index < bytes_to_parse)
      {
         node* pCur_node = &pNodes[cur_node_index];

         const uint max_admissable_match_len = LZHAM_MIN(CLZBase::cMaxMatchLen, bytes_to_parse - cur_node_index);
         const uint find_dict_size = m_accel.get_cur_dict_size() + cur_lookahead_ofs;

         const uint lit_pred0 = approx_state.get_pred_char(m_accel, cur_dict_ofs, 1);

         const uint8* pLookahead = &m_accel.m_dict[cur_dict_ofs];

         // full matches
         uint max_full_match_len = 0;
         uint num_full_matches = 0;
         uint len2_match_dist = 0;

         if (max_admissable_match_len >= cMinMatchLen)
         {
            const dict_match* pMatches = m_accel.find_matches(cur_lookahead_ofs);
            if (pMatches)
            {
               for ( ; ; )
               {
                  uint match_len = pMatches->get_len();
                  LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));
                  match_len = LZHAM_MIN(match_len, max_admissable_match_len);

                  if (match_len > max_full_match_len)
                  {
                     max_full_match_len = match_len;

                     match_lens[num_full_matches] = match_len;
                     match_distances[num_full_matches] = pMatches->get_dist();
                     num_full_matches++;
                  }

                  if (pMatches->is_last())
                     break;
                  pMatches++;
               }
            }

            len2_match_dist = m_accel.get_len2_match(cur_lookahead_ofs);
         }

         for (uint cur_node_state_index = 0; cur_node_state_index < pCur_node->m_num_node_states; cur_node_state_index++)
         {
            node_state &cur_node_state = pCur_node->m_node_states[cur_node_state_index];

            if (cur_node_index)
            {
               LZHAM_ASSERT(cur_node_state.m_parent_index >= 0);

               approx_state.restore_partial_state(cur_node_state.m_saved_state);
            }

            uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, approx_state.m_cur_state);

            const bit_cost_t cur_node_total_cost = cur_node_state.m_total_cost;
            const uint cur_node_total_complexity = cur_node_state.m_total_complexity;

            // rep matches
            uint match_hist_max_len = 0;
            uint match_hist_min_match_len = 1;
            for (uint rep_match_index = 0; rep_match_index < cMatchHistSize; rep_match_index++)
            {
               uint hist_match_len = 0;

               uint dist = approx_state.m_match_hist[rep_match_index];
               if (dist <= find_dict_size)
               {
                  const uint comp_pos = static_cast<uint>((m_accel.m_lookahead_pos + cur_lookahead_ofs - dist) & m_accel.m_max_dict_size_mask);
                  const uint8* pComp = &m_accel.m_dict[comp_pos];

                  for (hist_match_len = 0; hist_match_len < max_admissable_match_len; hist_match_len++)
                     if (pComp[hist_match_len] != pLookahead[hist_match_len])
                        break;
               }

               if (hist_match_len >= match_hist_min_match_len)
               {
                  match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

                  approx_state.get_rep_match_costs(cur_dict_ofs, lzdec_bitcosts, rep_match_index, match_hist_min_match_len, hist_match_len, is_match_model_index);

                  uint rep_match_total_complexity = cur_node_total_complexity + (cRep0Complexity + rep_match_index);
                  for (uint l = match_hist_min_match_len; l <= hist_match_len; l++)
                  {
#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, -((int)rep_match_index + 1));
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node& dst_node = pCur_node[l];

                     bit_cost_t rep_match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];

                     dst_node.add_state(cur_node_index, cur_node_state_index, lzdecision(cur_dict_ofs, l, -((int)rep_match_index + 1)), approx_state, rep_match_total_cost, rep_match_total_complexity);
                  }
               }

               match_hist_min_match_len = cMinMatchLen;
            }

            uint min_truncate_match_len = match_hist_max_len;

            // nearest len2 match
            if (len2_match_dist)
            {
               lzdecision lzdec(cur_dict_ofs, 2, len2_match_dist);
               bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, lzdec);
               pCur_node[2].add_state(cur_node_index, cur_node_state_index, lzdec, approx_state, cur_node_total_cost + actual_cost, cur_node_total_complexity + cShortMatchComplexity);

               min_truncate_match_len = LZHAM_MAX(min_truncate_match_len, 2);
            }

            // full matches
            if (max_full_match_len > min_truncate_match_len)
            {
               uint prev_max_match_len = LZHAM_MAX(1, min_truncate_match_len);
               for (uint full_match_index = 0; full_match_index < num_full_matches; full_match_index++)
               {
                  uint end_len = match_lens[full_match_index];
                  if (end_len <= min_truncate_match_len)
                     continue;

                  uint start_len = prev_max_match_len + 1;
                  uint match_dist = match_distances[full_match_index];

                  LZHAM_ASSERT(start_len <= end_len);

                  approx_state.get_full_match_costs(*this, cur_dict_ofs, lzdec_bitcosts, match_dist, start_len, end_len, is_match_model_index);

                  for (uint l = start_len; l <= end_len; l++)
                  {
                     uint match_complexity = (l >= cLongMatchComplexityLenThresh) ? cLongMatchComplexity : cShortMatchComplexity;

#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, match_dist);
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node& dst_node = pCur_node[l];

                     bit_cost_t match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];
                     uint match_total_complexity = cur_node_total_complexity + match_complexity;

                     dst_node.add_state( cur_node_index, cur_node_state_index, lzdecision(cur_dict_ofs, l, match_dist), approx_state, match_total_cost, match_total_complexity);
                  }

                  prev_max_match_len = end_len;
               }
            }

            // literal
            bit_cost_t lit_cost = approx_state.get_lit_cost(m_accel, cur_dict_ofs, lit_pred0, is_match_model_index);
            bit_cost_t lit_total_cost = cur_node_total_cost + lit_cost;
            uint lit_total_complexity = cur_node_total_complexity + cLitComplexity;
#if LZHAM_VERIFY_MATCH_COSTS
            {
               lzdecision actual_dec(cur_dict_ofs, 0, 0);
               bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
               LZHAM_ASSERT(actual_cost == lit_cost);
            }
#endif

            pCur_node[1].add_state( cur_node_index, cur_node_state_index, lzdecision(cur_dict_ofs, 0, 0), approx_state, lit_total_cost, lit_total_complexity);

         } // cur_node_state_index

         cur_dict_ofs++;
         cur_lookahead_ofs++;
         cur_node_index++;
      }

      // Now get the optimal decisions by starting from the goal node.
      // m_best_decisions is filled backwards.
      if (!parse_state.m_best_decisions.try_reserve(bytes_to_parse))
      {
         parse_state.m_failed = true;
         return false;
      }

      bit_cost_t lowest_final_cost = cBitCostMax; //math::cNearlyInfinite;
      int node_state_index = 0;
      node_state *pLast_node_states = pNodes[bytes_to_parse].m_node_states;
      for (uint i = 0; i < pNodes[bytes_to_parse].m_num_node_states; i++)
      {
         if (pLast_node_states[i].m_total_cost < lowest_final_cost)
         {
            lowest_final_cost = pLast_node_states[i].m_total_cost;
            node_state_index = i;
         }
      }

      int node_index = bytes_to_parse;
      lzdecision *pDst_dec = parse_state.m_best_decisions.get_ptr();
      do
      {
         LZHAM_ASSERT((node_index >= 0) && (node_index <= (int)cMaxParseGraphNodes));

         node& cur_node = pNodes[node_index];
         const node_state &cur_node_state = cur_node.m_node_states[node_state_index];

         *pDst_dec++ = cur_node_state.m_lzdec;

         node_index = cur_node_state.m_parent_index;
         node_state_index = cur_node_state.m_parent_state_index;

      } while (node_index > 0);

      parse_state.m_best_decisions.try_resize(static_cast<uint>(pDst_dec - parse_state.m_best_decisions.get_ptr()));

      return true;
   }